

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

void __thiscall
Am_Demon_Set::Set_Object_Demon(Am_Demon_Set *this,Am_Object_Demon_Type type,Am_Object_Demon *demon)

{
  if (type < (Am_DESTROY_OBJ|Am_COPY_OBJ)) {
    *(Am_Object_Demon **)((long)(this->data->change_demons + -3) + (ulong)type * 8) = demon;
  }
  return;
}

Assistant:

void
Am_Demon_Set::Set_Object_Demon(Am_Object_Demon_Type type,
                               Am_Object_Demon *demon)
{
  switch (type) {
  case Am_CREATE_OBJ:
    data->create_demon = demon;
    break;
  case Am_COPY_OBJ:
    data->copy_demon = demon;
    break;
  case Am_DESTROY_OBJ:
    data->destroy_demon = demon;
    break;
  }
}